

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapePiram>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  ulong uVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  TPZManVector<int,_27> scalarOrders;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  ulong uStack_140;
  ulong local_138;
  undefined8 local_130;
  int aiStack_128 [26];
  undefined1 local_c0 [16];
  ulong uStack_b0;
  ulong local_a8;
  int local_a0 [28];
  long lVar8;
  
  stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150._0_8_ = &PTR__TPZManVector_01840b58;
  uVar1 = ids->fNElements;
  local_158 = connectorders;
  if ((long)uVar1 < 9) {
    local_150._8_8_ = &local_130;
    local_138 = 0;
  }
  else {
    uStack_160 = (undefined1 *)0x1016bbd;
    local_150._8_8_ = operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_138 = uVar1;
  }
  if (0 < (long)uVar1) {
    plVar2 = ids->fStore;
    uVar5 = 0;
    do {
      *(long *)(local_150._8_8_ + uVar5 * 8) = plVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  uStack_160 = (undefined1 *)0x1016c05;
  uStack_140 = uVar1;
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)local_150);
  if ((undefined8 *)local_150._8_8_ == &local_130) {
    local_150._8_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150._0_8_ = &PTR__TPZVec_0183b5f0;
  if ((long *)local_150._8_8_ != (long *)0x0) {
    uStack_160 = (undefined1 *)0x1016c40;
    operator_delete__((void *)local_150._8_8_);
  }
  stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
  local_138 = 0;
  local_150._0_8_ = &PTR__TPZManVector_01840040;
  uVar1 = sideorient->fNElements;
  if ((long)uVar1 < 0x15) {
    local_150._8_8_ = &local_130;
    local_138 = 0;
  }
  else {
    uStack_160 = (undefined1 *)0x1016c94;
    local_150._8_8_ = operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    local_138 = uVar1;
  }
  if (0 < (long)uVar1) {
    piVar3 = sideorient->fStore;
    uVar5 = 0;
    do {
      *(int *)(local_150._8_8_ + uVar5 * 4) = piVar3[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  uStack_160 = (undefined1 *)0x1016cd9;
  uStack_140 = uVar1;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)local_150);
  if ((undefined8 *)local_150._8_8_ == &local_130) {
    local_150._8_8_ = (long *)0x0;
  }
  local_138 = 0;
  local_150._0_8_ = &PTR__TPZVec_0183b5b0;
  if ((long *)local_150._8_8_ != (long *)0x0) {
    uStack_160 = (undefined1 *)0x1016d15;
    operator_delete__((void *)local_150._8_8_);
  }
  iVar6 = local_158->fStore[5] + 1;
  uStack_160 = (undefined1 *)0x1016d33;
  TPZVec<int>::TPZVec((TPZVec<int> *)local_150,0);
  local_150._0_8_ = &PTR__TPZManVector_01840098;
  uStack_140 = 0xe;
  local_150._8_8_ = &local_130;
  local_138 = 0;
  lVar4 = 0xb;
  auVar7 = _DAT_014f8b30;
  auVar9 = _DAT_014f8340;
  do {
    if (SUB164(auVar9 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar9 ^ _DAT_014f8350,0) < -0x7ffffff2) {
      *(int *)((long)&uStack_160 + lVar4 * 4 + 4) = iVar6;
      *(int *)((long)&local_158 + lVar4 * 4) = iVar6;
    }
    if (SUB164(auVar7 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar7 ^ _DAT_014f8350,0) < -0x7ffffff2) {
      *(int *)((long)&local_158 + lVar4 * 4 + 4) = iVar6;
      *(int *)(local_150 + lVar4 * 4) = iVar6;
    }
    lVar8 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 4;
    auVar9._8_8_ = lVar8 + 4;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 4;
    auVar7._8_8_ = lVar8 + 4;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x1b);
  uStack_160 = (undefined1 *)0x1016e2a;
  TPZShapeH1<pzshape::TPZShapePiram>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,(TPZVec<int> *)local_150,data);
  if (local_158->fNElements == 6) {
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZManVector_01840098;
    uVar1 = local_158->fNElements;
    if ((long)uVar1 < 0x1c) {
      local_c0._8_8_ = local_a0;
      local_a8 = 0;
    }
    else {
      uStack_160 = (undefined1 *)0x1016e98;
      local_c0._8_8_ = operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
      local_a8 = uVar1;
    }
    if (0 < (long)uVar1) {
      piVar3 = local_158->fStore;
      uVar5 = 0;
      do {
        *(int *)(local_c0._8_8_ + uVar5 * 4) = piVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    uStack_160 = (undefined1 *)0x1016eef;
    uStack_b0 = uVar1;
    TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)local_c0);
    if ((int *)local_c0._8_8_ == local_a0) {
      local_c0._8_8_ = (int *)0x0;
    }
    local_a8 = 0;
    local_c0._0_8_ = &PTR__TPZVec_0183b5b0;
    if ((int *)local_c0._8_8_ != (int *)0x0) {
      uStack_160 = (undefined1 *)0x1016f2a;
      operator_delete__((void *)local_c0._8_8_);
    }
    uStack_160 = (undefined1 *)0x1016f3e;
    TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
    uStack_160 = &LAB_01016f4f;
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x1c5);
  }
  uStack_160 = (undefined1 *)0x1016e46;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x26);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}